

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satInterA.c
# Opt level: O1

void Inta_ManPrintResolvent(Vec_Int_t *vResLits)

{
  long lVar1;
  
  printf("Resolvent: {");
  if (0 < vResLits->nSize) {
    lVar1 = 0;
    do {
      printf(" %d",(ulong)(uint)vResLits->pArray[lVar1]);
      lVar1 = lVar1 + 1;
    } while (lVar1 < vResLits->nSize);
  }
  puts(" }");
  return;
}

Assistant:

void Inta_ManPrintResolvent( Vec_Int_t * vResLits )
{
    int i, Entry;
    printf( "Resolvent: {" );
    Vec_IntForEachEntry( vResLits, Entry, i )
        printf( " %d", Entry );
    printf( " }\n" );
}